

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * getblock(void)

{
  string name;
  string name_00;
  string cond;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  string m_key_name_16;
  string cond_00;
  string m_key_name_17;
  string m_key_name_18;
  string m_key_name_19;
  string m_key_name_20;
  string m_key_name_21;
  string cond_01;
  string m_key_name_22;
  string m_key_name_23;
  string m_key_name_24;
  string cond_02;
  string name_01;
  string m_key_name_25;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string m_key_name_26;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  string description_23;
  string m_key_name_27;
  string description_24;
  string description_25;
  string description_26;
  string m_key_name_28;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_23;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_24;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_25;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_26;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_27;
  string description_28;
  string description_29;
  string description_30;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_27;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_28;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_29;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_30;
  RPCExamples examples;
  string description_31;
  string description_32;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  long lVar3;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  initializer_list<RPCResult> __l_07;
  initializer_list<RPCResult> results_00;
  undefined4 in_stack_ffffffffffffdb78;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffdb7c;
  undefined1 in_stack_ffffffffffffdb80 [24];
  undefined8 in_stack_ffffffffffffdba0;
  undefined8 in_stack_ffffffffffffdba8;
  undefined8 in_stack_ffffffffffffdbb0;
  _Manager_type in_stack_ffffffffffffdbb8;
  undefined8 in_stack_ffffffffffffdbc0;
  pointer in_stack_ffffffffffffdbc8;
  pointer in_stack_ffffffffffffdbd0;
  undefined1 in_stack_ffffffffffffdbd8 [16];
  pointer in_stack_ffffffffffffdbe8;
  undefined8 in_stack_ffffffffffffdbf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffdbf8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffdc08;
  pointer in_stack_ffffffffffffdc18;
  pointer pRVar5;
  pointer in_stack_ffffffffffffdc20;
  pointer pRVar6;
  pointer in_stack_ffffffffffffdc28;
  undefined1 in_stack_ffffffffffffdc30 [40];
  pointer in_stack_ffffffffffffdc58;
  allocator<char> local_2389;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2388;
  allocator<char> local_236a;
  allocator<char> local_2369;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2368;
  allocator<char> local_234a;
  allocator<char> local_2349;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2348;
  allocator<char> local_232a;
  allocator<char> local_2329;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2328;
  allocator<char> local_230a;
  allocator<char> local_2309;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2308;
  allocator<char> local_22ec;
  allocator<char> local_22eb;
  allocator<char> local_22ea;
  allocator_type local_22e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_22e8;
  allocator<char> local_22ca;
  allocator<char> local_22c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_22c8;
  allocator<char> local_22aa;
  allocator<char> local_22a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_22a8;
  allocator<char> local_228a;
  allocator<char> local_2289;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2288;
  allocator<char> local_226a;
  allocator<char> local_2269;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2268;
  allocator<char> local_224a;
  allocator<char> local_2249;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2248;
  allocator<char> local_222a;
  allocator<char> local_2229;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2228;
  allocator<char> local_220a;
  allocator<char> local_2209;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2208;
  allocator<char> local_21e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_21e8;
  allocator<char> local_21ca;
  allocator_type local_21c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_21c8;
  allocator<char> local_21aa;
  allocator<char> local_21a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_21a8;
  allocator<char> local_218a;
  allocator<char> local_2189;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2188;
  allocator<char> local_216a;
  allocator<char> local_2169;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2168;
  allocator<char> local_214a;
  allocator<char> local_2149;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2148;
  allocator<char> local_212a;
  allocator<char> local_2129;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2128;
  allocator<char> local_210a;
  allocator<char> local_2109;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2108;
  allocator<char> local_20ea;
  allocator<char> local_20e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_20e8;
  allocator<char> local_20ca;
  allocator<char> local_20c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_20c8;
  allocator<char> local_20aa;
  allocator<char> local_20a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_20a8;
  allocator<char> local_208a;
  allocator<char> local_2089;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2088;
  allocator<char> local_206a;
  allocator<char> local_2069;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2068;
  allocator<char> local_204b;
  allocator<char> local_204a;
  allocator<char> local_2049;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2048;
  undefined8 local_2030;
  allocator<char> local_2023;
  allocator<char> local_2022;
  allocator<char> local_2021;
  RPCResults local_2020;
  allocator_type local_2002;
  allocator<char> local_2001;
  int local_2000;
  allocator<char> local_1ffb;
  allocator<char> local_1ffa;
  allocator<char> local_1ff9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1ff8;
  allocator<char> local_1fda;
  allocator<char> local_1fd9;
  string local_1fd8;
  string local_1fb8;
  string local_1f98;
  string local_1f78;
  string local_1f58;
  string local_1f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f18;
  char *local_1ef8;
  size_type local_1ef0;
  char local_1ee8 [8];
  undefined8 uStack_1ee0;
  RPCResult local_1ed8;
  string local_1e50 [32];
  string local_1e30 [32];
  RPCResult local_1e10;
  string local_1d88 [32];
  string local_1d68 [32];
  string local_1d48 [32];
  string local_1d28 [32];
  RPCResult local_1d08 [2];
  string local_1bf8 [32];
  string local_1bd8 [32];
  string local_1bb8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b78;
  string local_1b58 [32];
  string local_1b38 [32];
  string local_1b18 [32];
  RPCResult local_1af8 [2];
  string local_19e8 [32];
  string local_19c8 [32];
  RPCResult local_19a8;
  string local_1920 [32];
  string local_1900 [32];
  string local_18e0 [32];
  string local_18c0 [32];
  RPCResult local_18a0 [2];
  string local_1790 [32];
  string local_1770 [32];
  string local_1750 [32];
  string local_1730 [32];
  string local_1710 [32];
  string local_16f0 [32];
  string local_16d0 [32];
  string local_16b0 [32];
  string local_1690 [32];
  string local_1670 [32];
  string local_1650 [32];
  string local_1630 [32];
  string local_1610 [32];
  string local_15f0 [32];
  string local_15d0 [32];
  string local_15b0 [32];
  string local_1590 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1570;
  string local_1550 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1530;
  string local_1510 [32];
  string local_14f0 [32];
  string local_14d0 [32];
  RPCResult local_14b0;
  string local_1428 [32];
  string local_1408 [32];
  string local_13e8 [32];
  string local_13c8 [32];
  string local_13a8 [32];
  string local_1388 [32];
  string local_1368 [32];
  string local_1348 [32];
  string local_1328 [32];
  string local_1308 [32];
  string local_12e8 [32];
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [32];
  string local_1268 [32];
  string local_1248 [32];
  string local_1228 [32];
  string local_1208 [32];
  string local_11e8 [32];
  string local_11c8 [32];
  RPCResult local_11a8 [2];
  _Alloc_hider local_1030;
  RPCResult local_1010;
  RPCResult local_f88;
  RPCResult local_f00;
  RPCResult local_e78;
  RPCResult local_df0;
  RPCResult local_d68;
  RPCResult local_ce0;
  RPCResult local_c58;
  RPCResult local_bd0;
  RPCResult local_b48;
  RPCResult local_ac0;
  RPCResult local_a38;
  RPCResult local_9b0;
  RPCResult local_928;
  RPCResult local_8a0;
  RPCResult local_818;
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  RPCResult local_6d0 [4];
  RPCArgOptions local_4b0;
  string local_468 [32];
  UniValue local_448;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  string local_390 [32];
  RPCArgOptions local_370;
  string local_328 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  string local_2a8 [32];
  RPCArg local_288 [2];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030._M_p = (pointer)0x0;
  local_2030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getblock",&local_1fd9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "\nIf verbosity is 0, returns a string that is serialized, hex-encoded data for block \'hash\'.\nIf verbosity is 1, returns an Object with information about block <hash>.\nIf verbosity is 2, returns an Object with information about block <hash> and information about each transaction.\nIf verbosity is 3, returns an Object with information about block <hash> and information about each transaction, including prevout information for inputs (only for unpruned blocks in the current best chain).\n"
             ,&local_1fda);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"blockhash",&local_1ff9);
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_328,"The block hash",&local_1ffa);
  local_370.oneline_description._M_dataplus._M_p = (pointer)&local_370.oneline_description.field_2;
  local_370.skip_type_check = false;
  local_370.oneline_description._M_string_length = 0;
  local_370.oneline_description.field_2._M_local_buf[0] = '\0';
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_370._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  name._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffdb80._8_16_;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdba0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdba8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdbb0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffdbb8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffdbc0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdbc8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdbd0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_ffffffffffffdbd8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdbe8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdbf0;
  description_31.field_2 = in_stack_ffffffffffffdc08;
  description_31._0_16_ = in_stack_ffffffffffffdbf8;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdc20;
  opts._0_8_ = in_stack_ffffffffffffdc18;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffdc28;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdc30._0_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffdc30._16_24_;
  opts._64_8_ = in_stack_ffffffffffffdc58;
  RPCArg::RPCArg(local_288,name,(Type)local_2a8,fallback,description_31,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_390,"verbosity|verbose",&local_1ffb);
  local_2000 = 1;
  UniValue::UniValue<int,_int,_true>(&local_448,&local_2000);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_3f0,&local_448);
  std::__cxx11::string::string<std::allocator<char>>
            (local_468,
             "0 for hex-encoded data, 1 for a JSON object, 2 for JSON object with transaction data, and 3 for JSON object with transaction data including prevout information for inputs"
             ,&local_2001);
  local_4b0.oneline_description._M_dataplus._M_p = (pointer)&local_4b0.oneline_description.field_2;
  local_4b0.skip_type_check = true;
  local_4b0.oneline_description._M_string_length = 0;
  local_4b0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_4b0._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  name_00._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdba0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdba8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdbb0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffdbb8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffdbc0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdbc8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdbd0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_ffffffffffffdbd8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdbe8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdbf0;
  description_32.field_2 = in_stack_ffffffffffffdc08;
  description_32._0_16_ = in_stack_ffffffffffffdbf8;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdc20;
  opts_00._0_8_ = in_stack_ffffffffffffdc18;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffdc28;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdc30._0_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffdc30._16_24_;
  opts_00._64_8_ = in_stack_ffffffffffffdc58;
  RPCArg::RPCArg(local_288 + 1,name_00,(Type)local_390,fallback_00,description_32,opts_00);
  __l._M_len = 2;
  __l._M_array = local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1ff8,__l,&local_2002);
  std::__cxx11::string::string<std::allocator<char>>(local_6f0,"for verbosity = 0",&local_2021);
  std::__cxx11::string::string<std::allocator<char>>(local_710,"",&local_2022);
  std::__cxx11::string::string<std::allocator<char>>
            (local_730,"A string that is serialized, hex-encoded data for block \'hash\'",
             &local_2023);
  local_2048.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2048.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2048.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cond._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  cond._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  cond._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  cond.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffdb80._8_16_;
  m_key_name_25._M_string_length = in_stack_ffffffffffffdba0;
  m_key_name_25._M_dataplus._M_p = (pointer)in_RDI;
  m_key_name_25.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  m_key_name_25.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  description_27._M_string_length = in_stack_ffffffffffffdbc0;
  description_27._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbb8;
  description_27.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdbc8;
  description_27.field_2._8_8_ = in_stack_ffffffffffffdbd0;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdbe8;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbd8._0_8_;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbd8._8_8_;
  RPCResult::RPCResult(local_6d0,cond,(Type)local_6f0,m_key_name_25,description_27,inner_27);
  std::__cxx11::string::string<std::allocator<char>>(local_750,"for verbosity = 1",&local_2049);
  std::__cxx11::string::string<std::allocator<char>>(local_770,"",&local_204a);
  std::__cxx11::string::string<std::allocator<char>>(local_790,"",&local_204b);
  std::__cxx11::string::string<std::allocator<char>>(local_11c8,"hash",&local_2069);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11e8,"the block hash (same as provided)",&local_206a);
  local_2088.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2088.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2088.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description._M_string_length = in_stack_ffffffffffffdba0;
  description._M_dataplus._M_p = (pointer)in_RDI;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(local_11a8,STR_HEX,m_key_name,description,inner,SUB81(local_11c8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1208,"confirmations",&local_2089);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1228,"The number of confirmations, or -1 if the block is not on the main chain",
             &local_208a);
  local_20a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_20a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_00._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_00._M_string_length = in_stack_ffffffffffffdba0;
  description_00._M_dataplus._M_p = (pointer)in_RDI;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(local_11a8 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_1208,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1248,"size",&local_20a9);
  std::__cxx11::string::string<std::allocator<char>>(local_1268,"The block size",&local_20aa);
  local_20c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_20c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_01._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_01._M_string_length = in_stack_ffffffffffffdba0;
  description_01._M_dataplus._M_p = (pointer)in_RDI;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult
            ((RPCResult *)&stack0xffffffffffffef68,NUM,m_key_name_01,description_01,inner_01,
             SUB81(local_1248,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1288,"strippedsize",&local_20c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_12a8,"The block size excluding witness data",&local_20ca);
  local_20e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_20e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_02._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_02._M_string_length = in_stack_ffffffffffffdba0;
  description_02._M_dataplus._M_p = (pointer)in_RDI;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_1010,NUM,m_key_name_02,description_02,inner_02,SUB81(local_1288,0));
  std::__cxx11::string::string<std::allocator<char>>(local_12c8,"weight",&local_20e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_12e8,"The block weight as defined in BIP 141",&local_20ea);
  local_2108.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2108.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2108.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_03._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_03._M_string_length = in_stack_ffffffffffffdba0;
  description_03._M_dataplus._M_p = (pointer)in_RDI;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_f88,NUM,m_key_name_03,description_03,inner_03,SUB81(local_12c8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1308,"height",&local_2109);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1328,"The block height or index",&local_210a);
  local_2128.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2128.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2128.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_04._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_04._M_string_length = in_stack_ffffffffffffdba0;
  description_04._M_dataplus._M_p = (pointer)in_RDI;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_f00,NUM,m_key_name_04,description_04,inner_04,SUB81(local_1308,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1348,"version",&local_2129);
  std::__cxx11::string::string<std::allocator<char>>(local_1368,"The block version",&local_212a);
  local_2148.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2148.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2148.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_05._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_05._M_string_length = in_stack_ffffffffffffdba0;
  description_05._M_dataplus._M_p = (pointer)in_RDI;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_e78,NUM,m_key_name_05,description_05,inner_05,SUB81(local_1348,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1388,"versionHex",&local_2149);
  std::__cxx11::string::string<std::allocator<char>>
            (local_13a8,"The block version formatted in hexadecimal",&local_214a);
  local_2168.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2168.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2168.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_06._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_06._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_06._M_string_length = in_stack_ffffffffffffdba0;
  description_06._M_dataplus._M_p = (pointer)in_RDI;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_df0,STR_HEX,m_key_name_06,description_06,inner_06,SUB81(local_1388,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_13c8,"merkleroot",&local_2169);
  std::__cxx11::string::string<std::allocator<char>>(local_13e8,"The merkle root",&local_216a);
  local_2188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_07._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_07._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_07._M_string_length = in_stack_ffffffffffffdba0;
  description_07._M_dataplus._M_p = (pointer)in_RDI;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_d68,STR_HEX,m_key_name_07,description_07,inner_07,SUB81(local_13c8,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1408,"tx",&local_2189);
  std::__cxx11::string::string<std::allocator<char>>(local_1428,"The transaction ids",&local_218a);
  std::__cxx11::string::string<std::allocator<char>>(local_14d0,"",&local_21a9);
  std::__cxx11::string::string<std::allocator<char>>(local_14f0,"The transaction id",&local_21aa);
  local_21c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_21c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_21c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_08._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_08._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_08.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_08._M_string_length = in_stack_ffffffffffffdba0;
  description_08._M_dataplus._M_p = (pointer)in_RDI;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult
            (&local_14b0,STR_HEX,m_key_name_08,description_08,inner_08,SUB81(local_14d0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_14b0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_21a8,__l_00,&local_21c9);
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_09._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_09._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_09.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_09._M_string_length = in_stack_ffffffffffffdba0;
  description_09._M_dataplus._M_p = (pointer)in_RDI;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_ce0,ARR,m_key_name_09,description_09,inner_09,SUB81(local_1408,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1510,"time",&local_21ca);
  std::operator+(&local_1530,"The block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_21e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_21e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_21e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_10._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_10._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_10.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_10._M_string_length = in_stack_ffffffffffffdba0;
  description_10._M_dataplus._M_p = (pointer)in_RDI;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult
            (&local_c58,NUM_TIME,m_key_name_10,description_10,inner_10,SUB81(local_1510,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1550,"mediantime",&local_21e9);
  std::operator+(&local_1570,"The median block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_2208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_11._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_11._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_11.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_11._M_string_length = in_stack_ffffffffffffdba0;
  description_11._M_dataplus._M_p = (pointer)in_RDI;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult
            (&local_bd0,NUM_TIME,m_key_name_11,description_11,inner_11,SUB81(local_1550,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1590,"nonce",&local_2209);
  std::__cxx11::string::string<std::allocator<char>>(local_15b0,"The nonce",&local_220a);
  local_2228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_12._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_12._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_12.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_12._M_string_length = in_stack_ffffffffffffdba0;
  description_12._M_dataplus._M_p = (pointer)in_RDI;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_b48,NUM,m_key_name_12,description_12,inner_12,SUB81(local_1590,0));
  std::__cxx11::string::string<std::allocator<char>>(local_15d0,"bits",&local_2229);
  std::__cxx11::string::string<std::allocator<char>>(local_15f0,"The bits",&local_222a);
  local_2248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_13._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_13._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_13.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_13._M_string_length = in_stack_ffffffffffffdba0;
  description_13._M_dataplus._M_p = (pointer)in_RDI;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_ac0,STR_HEX,m_key_name_13,description_13,inner_13,SUB81(local_15d0,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1610,"difficulty",&local_2249);
  std::__cxx11::string::string<std::allocator<char>>(local_1630,"The difficulty",&local_224a);
  local_2268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_14._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_14._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_14._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_14.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_14._M_string_length = in_stack_ffffffffffffdba0;
  description_14._M_dataplus._M_p = (pointer)in_RDI;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_14.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_a38,NUM,m_key_name_14,description_14,inner_14,SUB81(local_1610,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1650,"chainwork",&local_2269);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1670,
             "Expected number of hashes required to produce the chain up to this block (in hex)",
             &local_226a);
  local_2288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_15._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_15._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_15._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_15.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_15._M_string_length = in_stack_ffffffffffffdba0;
  description_15._M_dataplus._M_p = (pointer)in_RDI;
  description_15.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_9b0,STR_HEX,m_key_name_15,description_15,inner_15,SUB81(local_1650,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1690,"nTx",&local_2289);
  std::__cxx11::string::string<std::allocator<char>>
            (local_16b0,"The number of transactions in the block",&local_228a);
  local_22a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_22a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_22a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_16._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_16._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdb78;
  m_key_name_16._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_16.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_16._M_string_length = in_stack_ffffffffffffdba0;
  description_16._M_dataplus._M_p = (pointer)in_RDI;
  description_16.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_928,NUM,m_key_name_16,description_16,inner_16,SUB81(local_1690,0));
  std::__cxx11::string::string<std::allocator<char>>(local_16d0,"previousblockhash",&local_22a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_16f0,"The hash of the previous block (if available)",&local_22aa);
  local_22c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_22c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_22c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_24_ = in_stack_ffffffffffffdb80;
  auVar1._0_4_ = in_stack_ffffffffffffdb7c;
  auVar1._28_4_ = 0;
  description_17._M_string_length = in_stack_ffffffffffffdba0;
  description_17._M_dataplus._M_p = (pointer)in_RDI;
  description_17.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult
            (&local_8a0,STR_HEX,(string)(auVar1 << 0x20),SUB81(local_16d0,0),description_17,inner_17
             ,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1710,"nextblockhash",&local_22c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1730,"The hash of the next block (if available)",&local_22ca);
  local_22e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_22e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_22e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = 0;
  auVar2._4_24_ = in_stack_ffffffffffffdb80;
  auVar2._0_4_ = in_stack_ffffffffffffdb7c;
  auVar2._28_4_ = 0;
  description_18._M_string_length = in_stack_ffffffffffffdba0;
  description_18._M_dataplus._M_p = (pointer)in_RDI;
  description_18.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult
            (&local_818,STR_HEX,(string)(auVar2 << 0x20),SUB81(local_1710,0),description_18,inner_18
             ,true);
  __l_01._M_len = 0x13;
  __l_01._M_array = local_11a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2068,__l_01,&local_22e9);
  cond_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  cond_00._M_dataplus._M_p._0_4_ = uVar4;
  cond_00._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  cond_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  m_key_name_26._M_string_length = in_stack_ffffffffffffdba0;
  m_key_name_26._M_dataplus._M_p = (pointer)in_RDI;
  m_key_name_26.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  m_key_name_26.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  description_28._M_string_length = in_stack_ffffffffffffdbc0;
  description_28._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbb8;
  description_28.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdbc8;
  description_28.field_2._8_8_ = in_stack_ffffffffffffdbd0;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdbe8;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbd8._0_8_;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbd8._8_8_;
  RPCResult::RPCResult(local_6d0 + 1,cond_00,(Type)local_750,m_key_name_26,description_28,inner_28);
  std::__cxx11::string::string<std::allocator<char>>(local_1750,"for verbosity = 2",&local_22ea);
  std::__cxx11::string::string<std::allocator<char>>(local_1770,"",&local_22eb);
  std::__cxx11::string::string<std::allocator<char>>(local_1790,"",&local_22ec);
  std::__cxx11::string::string<std::allocator<char>>(local_18c0,"",&local_2309);
  std::__cxx11::string::string<std::allocator<char>>
            (local_18e0,"Same output as verbosity = 1",&local_230a);
  local_2328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_17._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_17._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_17._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_17.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_19._M_string_length = in_stack_ffffffffffffdba0;
  description_19._M_dataplus._M_p = (pointer)in_RDI;
  description_19.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_19.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(local_18a0,ELISION,m_key_name_17,description_19,inner_19,SUB81(local_18c0,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1900,"tx",&local_2329);
  std::__cxx11::string::string<std::allocator<char>>(local_1920,"",&local_232a);
  std::__cxx11::string::string<std::allocator<char>>(local_19c8,"",&local_2349);
  std::__cxx11::string::string<std::allocator<char>>(local_19e8,"",&local_234a);
  std::__cxx11::string::string<std::allocator<char>>(local_1b18,"",&local_2369);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b38,
             "The transactions in the format of the getrawtransaction RPC. Different from verbosity = 1 \"tx\" result"
             ,&local_236a);
  local_2388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_18._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_18._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_18._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_18.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_20._M_string_length = in_stack_ffffffffffffdba0;
  description_20._M_dataplus._M_p = (pointer)in_RDI;
  description_20.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_20.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(local_1af8,ELISION,m_key_name_18,description_20,inner_20,SUB81(local_1b18,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1b58,"fee",&local_2389);
  std::operator+(&local_1b98,"The transaction fee in ",&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_1b78,&local_1b98,", omitted if block undo data is not available");
  m_key_name_19._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_19._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_19._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_19.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_21._M_string_length = in_stack_ffffffffffffdba0;
  description_21._M_dataplus._M_p = (pointer)in_RDI;
  description_21.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_21.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(local_1af8 + 1,NUM,m_key_name_19,description_21,inner_21,SUB81(local_1b58,0))
  ;
  __l_02._M_len = 2;
  __l_02._M_array = local_1af8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2368,__l_02,(allocator_type *)&stack0xffffffffffffdc57);
  m_key_name_20._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_20._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_20._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_20.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_22._M_string_length = in_stack_ffffffffffffdba0;
  description_22._M_dataplus._M_p = (pointer)in_RDI;
  description_22.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_22.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_19a8,OBJ,m_key_name_20,description_22,inner_22,SUB81(local_19c8,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_19a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2348,__l_03,(allocator_type *)&stack0xffffffffffffdc56);
  m_key_name_21._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_21._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_21._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_21.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_23._M_string_length = in_stack_ffffffffffffdba0;
  description_23._M_dataplus._M_p = (pointer)in_RDI;
  description_23.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_23.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(local_18a0 + 1,ARR,m_key_name_21,description_23,inner_23,false);
  __l_04._M_len = 2;
  __l_04._M_array = local_18a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2308,__l_04,(allocator_type *)&stack0xffffffffffffdc55);
  cond_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  cond_01._M_dataplus._M_p._0_4_ = uVar4;
  cond_01._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  cond_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  m_key_name_27._M_string_length = in_stack_ffffffffffffdba0;
  m_key_name_27._M_dataplus._M_p = (pointer)in_RDI;
  m_key_name_27.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  m_key_name_27.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  description_29._M_string_length = in_stack_ffffffffffffdbc0;
  description_29._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbb8;
  description_29.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdbc8;
  description_29.field_2._8_8_ = in_stack_ffffffffffffdbd0;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdbe8;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbd8._0_8_;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbd8._8_8_;
  RPCResult::RPCResult(local_6d0 + 2,cond_01,(Type)local_1750,m_key_name_27,description_29,inner_29)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1bb8,"for verbosity = 3",(allocator<char> *)&stack0xffffffffffffdc54);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1bd8,"",(allocator<char> *)&stack0xffffffffffffdc53);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1bf8,"",(allocator<char> *)&stack0xffffffffffffdc52);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d28,"",(allocator<char> *)&stack0xffffffffffffdc37);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d48,"Same output as verbosity = 2",(allocator<char> *)&stack0xffffffffffffdc36);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  m_key_name_22._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_22._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_22._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_22.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_24._M_string_length = in_stack_ffffffffffffdba0;
  description_24._M_dataplus._M_p = (pointer)in_RDI;
  description_24.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_24.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(local_1d08,ELISION,m_key_name_22,description_24,inner_24,SUB81(local_1d28,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d68,"tx",(allocator<char> *)&stack0xffffffffffffdc17);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d88,"",(allocator<char> *)&stack0xffffffffffffdc16);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e30,"",(allocator<char> *)&stack0xffffffffffffdbf7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e50,"",(allocator<char> *)&stack0xffffffffffffdbf6);
  RPCResult::RPCResult(&local_1ed8,&getblock_vin);
  __l_05._M_len = 1;
  __l_05._M_array = &local_1ed8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdbd8,__l_05,
             (allocator_type *)&stack0xffffffffffffdbd7);
  m_key_name_23._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_23._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_23._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_23.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_25._M_string_length = in_stack_ffffffffffffdba0;
  description_25._M_dataplus._M_p = (pointer)in_RDI;
  description_25.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_25.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(&local_1e10,OBJ,m_key_name_23,description_25,inner_25,SUB81(local_1e30,0));
  __l_06._M_len = 1;
  __l_06._M_array = &local_1e10;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdbf8,__l_06,
             (allocator_type *)&stack0xffffffffffffdbd6);
  m_key_name_24._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  m_key_name_24._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_24._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  m_key_name_24.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  description_26._M_string_length = in_stack_ffffffffffffdba0;
  description_26._M_dataplus._M_p = (pointer)in_RDI;
  description_26.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  description_26.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbc0;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbb8;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdbc8;
  RPCResult::RPCResult(local_1d08 + 1,ARR,m_key_name_24,description_26,inner_26,SUB81(local_1d68,0))
  ;
  __l_07._M_len = 2;
  __l_07._M_array = local_1d08;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc38,__l_07,
             (allocator_type *)&stack0xffffffffffffdbd5);
  cond_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdb7c;
  cond_02._M_dataplus._M_p._0_4_ = uVar4;
  cond_02._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  cond_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  m_key_name_28._M_string_length = in_stack_ffffffffffffdba0;
  m_key_name_28._M_dataplus._M_p = (pointer)in_RDI;
  m_key_name_28.field_2._M_allocated_capacity = in_stack_ffffffffffffdba8;
  m_key_name_28.field_2._8_8_ = in_stack_ffffffffffffdbb0;
  description_30._M_string_length = in_stack_ffffffffffffdbc0;
  description_30._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbb8;
  description_30.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdbc8;
  description_30.field_2._8_8_ = in_stack_ffffffffffffdbd0;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdbe8;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdbd8._0_8_;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdbd8._8_8_;
  RPCResult::RPCResult(local_6d0 + 3,cond_02,(Type)local_1bb8,m_key_name_28,description_30,inner_30)
  ;
  results_00._M_len = 4;
  results_00._M_array = local_6d0;
  RPCResults::RPCResults(&local_2020,results_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f58,"getblock",(allocator<char> *)&stack0xffffffffffffdbd4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f78,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"",
             (allocator<char> *)&stack0xffffffffffffdbd3);
  HelpExampleCli(&local_1f38,&local_1f58,&local_1f78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1fb8,"getblock",(allocator<char> *)&stack0xffffffffffffdbd2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1fd8,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"",
             (allocator<char> *)&stack0xffffffffffffdbd1);
  HelpExampleRpc(&local_1f98,&local_1fb8,&local_1fd8);
  std::operator+(&local_1f18,&local_1f38,&local_1f98);
  local_1ef8 = local_1ee8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f18._M_dataplus._M_p == &local_1f18.field_2) {
    uStack_1ee0 = local_1f18.field_2._8_8_;
  }
  else {
    local_1ef8 = local_1f18._M_dataplus._M_p;
  }
  local_1ef0 = local_1f18._M_string_length;
  local_1f18._M_string_length = 0;
  local_1f18.field_2._M_local_buf[0] = '\0';
  name_01._M_string_length = in_stack_ffffffffffffdb80._0_8_;
  name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffdb80._8_16_;
  name_01._M_dataplus._M_p = &stack0xffffffffffffdba8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)std::
                  _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:756:9)>
                  ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)std::
                  _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:756:9)>
                  ::_M_manager;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffdbc8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffdbd8._0_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffdbd8._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = in_stack_ffffffffffffdbd0;
  examples.m_examples._M_string_length = in_stack_ffffffffffffdbf0;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbe8;
  examples.m_examples.field_2 = in_stack_ffffffffffffdbf8;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar5;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_ffffffffffffdc08._M_local_buf;
  fun._M_invoker = (_Invoker_type)pRVar6;
  local_1f18._M_dataplus._M_p = (pointer)&local_1f18.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_01,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffdba0,in_RDI)),args,
             results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffdba8);
  std::__cxx11::string::~string((string *)&local_1ef8);
  std::__cxx11::string::~string((string *)&local_1f18);
  std::__cxx11::string::~string((string *)&local_1f98);
  std::__cxx11::string::~string((string *)&local_1fd8);
  std::__cxx11::string::~string((string *)&local_1fb8);
  std::__cxx11::string::~string((string *)&local_1f38);
  std::__cxx11::string::~string((string *)&local_1f78);
  std::__cxx11::string::~string((string *)&local_1f58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2020.m_results);
  lVar3 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_6d0[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc38);
  lVar3 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1d08[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdbf8);
  RPCResult::~RPCResult(&local_1e10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdbd8);
  RPCResult::~RPCResult(&local_1ed8);
  std::__cxx11::string::~string(local_1e50);
  std::__cxx11::string::~string(local_1e30);
  std::__cxx11::string::~string(local_1d88);
  std::__cxx11::string::~string(local_1d68);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc18);
  std::__cxx11::string::~string(local_1d48);
  std::__cxx11::string::~string(local_1d28);
  std::__cxx11::string::~string(local_1bf8);
  std::__cxx11::string::~string(local_1bd8);
  std::__cxx11::string::~string(local_1bb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2308);
  lVar3 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_18a0[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2348);
  RPCResult::~RPCResult(&local_19a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2368);
  lVar3 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1af8[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc58);
  std::__cxx11::string::~string((string *)&local_1b78);
  std::__cxx11::string::~string((string *)&local_1b98);
  std::__cxx11::string::~string(local_1b58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2388);
  std::__cxx11::string::~string(local_1b38);
  std::__cxx11::string::~string(local_1b18);
  std::__cxx11::string::~string(local_19e8);
  std::__cxx11::string::~string(local_19c8);
  std::__cxx11::string::~string(local_1920);
  std::__cxx11::string::~string(local_1900);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2328);
  std::__cxx11::string::~string(local_18e0);
  std::__cxx11::string::~string(local_18c0);
  std::__cxx11::string::~string(local_1790);
  std::__cxx11::string::~string(local_1770);
  std::__cxx11::string::~string(local_1750);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2068);
  lVar3 = 0x990;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_11a8[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_22e8);
  std::__cxx11::string::~string(local_1730);
  std::__cxx11::string::~string(local_1710);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_22c8);
  std::__cxx11::string::~string(local_16f0);
  std::__cxx11::string::~string(local_16d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_22a8);
  std::__cxx11::string::~string(local_16b0);
  std::__cxx11::string::~string(local_1690);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2288);
  std::__cxx11::string::~string(local_1670);
  std::__cxx11::string::~string(local_1650);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2268);
  std::__cxx11::string::~string(local_1630);
  std::__cxx11::string::~string(local_1610);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2248);
  std::__cxx11::string::~string(local_15f0);
  std::__cxx11::string::~string(local_15d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2228);
  std::__cxx11::string::~string(local_15b0);
  std::__cxx11::string::~string(local_1590);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2208);
  std::__cxx11::string::~string((string *)&local_1570);
  std::__cxx11::string::~string(local_1550);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_21e8);
  std::__cxx11::string::~string((string *)&local_1530);
  std::__cxx11::string::~string(local_1510);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_21a8);
  RPCResult::~RPCResult(&local_14b0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_21c8);
  std::__cxx11::string::~string(local_14f0);
  std::__cxx11::string::~string(local_14d0);
  std::__cxx11::string::~string(local_1428);
  std::__cxx11::string::~string(local_1408);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2188);
  std::__cxx11::string::~string(local_13e8);
  std::__cxx11::string::~string(local_13c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2168);
  std::__cxx11::string::~string(local_13a8);
  std::__cxx11::string::~string(local_1388);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2148);
  std::__cxx11::string::~string(local_1368);
  std::__cxx11::string::~string(local_1348);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2128);
  std::__cxx11::string::~string(local_1328);
  std::__cxx11::string::~string(local_1308);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2108);
  std::__cxx11::string::~string(local_12e8);
  std::__cxx11::string::~string(local_12c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_20e8);
  std::__cxx11::string::~string(local_12a8);
  std::__cxx11::string::~string(local_1288);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_20c8);
  std::__cxx11::string::~string(local_1268);
  std::__cxx11::string::~string(local_1248);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_20a8);
  std::__cxx11::string::~string(local_1228);
  std::__cxx11::string::~string(local_1208);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2088);
  std::__cxx11::string::~string(local_11e8);
  std::__cxx11::string::~string(local_11c8);
  std::__cxx11::string::~string(local_790);
  std::__cxx11::string::~string(local_770);
  std::__cxx11::string::~string(local_750);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2048);
  std::__cxx11::string::~string(local_730);
  std::__cxx11::string::~string(local_710);
  std::__cxx11::string::~string(local_6f0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1ff8);
  lVar3 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_288[0].m_names._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x108;
  } while (lVar3 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_4b0);
  std::__cxx11::string::~string(local_468);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_3f0);
  UniValue::~UniValue(&local_448);
  std::__cxx11::string::~string(local_390);
  RPCArgOptions::~RPCArgOptions(&local_370);
  std::__cxx11::string::~string(local_328);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblock()
{
    return RPCHelpMan{"getblock",
                "\nIf verbosity is 0, returns a string that is serialized, hex-encoded data for block 'hash'.\n"
                "If verbosity is 1, returns an Object with information about block <hash>.\n"
                "If verbosity is 2, returns an Object with information about block <hash> and information about each transaction.\n"
                "If verbosity is 3, returns an Object with information about block <hash> and information about each transaction, including prevout information for inputs (only for unpruned blocks in the current best chain).\n",
                {
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The block hash"},
                    {"verbosity|verbose", RPCArg::Type::NUM, RPCArg::Default{1}, "0 for hex-encoded data, 1 for a JSON object, 2 for JSON object with transaction data, and 3 for JSON object with transaction data including prevout information for inputs",
                     RPCArgOptions{.skip_type_check = true}},
                },
                {
                    RPCResult{"for verbosity = 0",
                RPCResult::Type::STR_HEX, "", "A string that is serialized, hex-encoded data for block 'hash'"},
                    RPCResult{"for verbosity = 1",
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::STR_HEX, "hash", "the block hash (same as provided)"},
                    {RPCResult::Type::NUM, "confirmations", "The number of confirmations, or -1 if the block is not on the main chain"},
                    {RPCResult::Type::NUM, "size", "The block size"},
                    {RPCResult::Type::NUM, "strippedsize", "The block size excluding witness data"},
                    {RPCResult::Type::NUM, "weight", "The block weight as defined in BIP 141"},
                    {RPCResult::Type::NUM, "height", "The block height or index"},
                    {RPCResult::Type::NUM, "version", "The block version"},
                    {RPCResult::Type::STR_HEX, "versionHex", "The block version formatted in hexadecimal"},
                    {RPCResult::Type::STR_HEX, "merkleroot", "The merkle root"},
                    {RPCResult::Type::ARR, "tx", "The transaction ids",
                        {{RPCResult::Type::STR_HEX, "", "The transaction id"}}},
                    {RPCResult::Type::NUM_TIME, "time",       "The block time expressed in " + UNIX_EPOCH_TIME},
                    {RPCResult::Type::NUM_TIME, "mediantime", "The median block time expressed in " + UNIX_EPOCH_TIME},
                    {RPCResult::Type::NUM, "nonce", "The nonce"},
                    {RPCResult::Type::STR_HEX, "bits", "The bits"},
                    {RPCResult::Type::NUM, "difficulty", "The difficulty"},
                    {RPCResult::Type::STR_HEX, "chainwork", "Expected number of hashes required to produce the chain up to this block (in hex)"},
                    {RPCResult::Type::NUM, "nTx", "The number of transactions in the block"},
                    {RPCResult::Type::STR_HEX, "previousblockhash", /*optional=*/true, "The hash of the previous block (if available)"},
                    {RPCResult::Type::STR_HEX, "nextblockhash", /*optional=*/true, "The hash of the next block (if available)"},
                }},
                    RPCResult{"for verbosity = 2",
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::ELISION, "", "Same output as verbosity = 1"},
                    {RPCResult::Type::ARR, "tx", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::ELISION, "", "The transactions in the format of the getrawtransaction RPC. Different from verbosity = 1 \"tx\" result"},
                            {RPCResult::Type::NUM, "fee", "The transaction fee in " + CURRENCY_UNIT + ", omitted if block undo data is not available"},
                        }},
                    }},
                }},
                    RPCResult{"for verbosity = 3",
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::ELISION, "", "Same output as verbosity = 2"},
                    {RPCResult::Type::ARR, "tx", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            getblock_vin,
                        }},
                    }},
                }},
        },
                RPCExamples{
                    HelpExampleCli("getblock", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"")
            + HelpExampleRpc("getblock", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    uint256 hash(ParseHashV(request.params[0], "blockhash"));

    int verbosity = 1;
    if (!request.params[1].isNull()) {
        if (request.params[1].isBool()) {
            verbosity = request.params[1].get_bool() ? 1 : 0;
        } else {
            verbosity = request.params[1].getInt<int>();
        }
    }

    const CBlockIndex* pblockindex;
    const CBlockIndex* tip;
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    {
        LOCK(cs_main);
        pblockindex = chainman.m_blockman.LookupBlockIndex(hash);
        tip = chainman.ActiveChain().Tip();

        if (!pblockindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
    }

    const std::vector<uint8_t> block_data{GetRawBlockChecked(chainman.m_blockman, *pblockindex)};

    if (verbosity <= 0) {
        return HexStr(block_data);
    }

    DataStream block_stream{block_data};
    CBlock block{};
    block_stream >> TX_WITH_WITNESS(block);

    TxVerbosity tx_verbosity;
    if (verbosity == 1) {
        tx_verbosity = TxVerbosity::SHOW_TXID;
    } else if (verbosity == 2) {
        tx_verbosity = TxVerbosity::SHOW_DETAILS;
    } else {
        tx_verbosity = TxVerbosity::SHOW_DETAILS_AND_PREVOUT;
    }

    return blockToJSON(chainman.m_blockman, block, *tip, *pblockindex, tx_verbosity);
},
    };
}